

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

LoopFlags __thiscall BVFixed::GetRange<Js::LoopFlags>(BVFixed *this,BVIndex start,BVIndex len)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  BVIndex BVar4;
  BVIndex BVar5;
  undefined4 *puVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  byte bVar9;
  ulong local_70;
  uint local_60;
  int local_5c;
  uint i;
  int nBitsUsed;
  unsigned_long endWord;
  unsigned_long startWord;
  uint64 range;
  uint64 mask;
  BVIndex oEnd;
  BVIndex oStart;
  BVIndex iEnd;
  BVIndex iStart;
  BVIndex end;
  BVIndex len_local;
  BVIndex start_local;
  BVFixed *this_local;
  
  AssertRange(this,start);
  if (len == 0) {
    Js::LoopFlags::LoopFlags((LoopFlags *)((long)&this_local + 7),0);
  }
  else {
    if (8 < len) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                         ,0xb7,"(len <= sizeof(Container) * MachBits)",
                         "len <= sizeof(Container) * MachBits");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (0x40 < len) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                         ,0xb8,"(len <= 64)","Currently doesn\'t support range bigger than 64 bits")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    BVar3 = (start + len) - 1;
    AssertRange(this,BVar3);
    local_60 = BVUnitT<unsigned_long>::Position(start);
    BVar4 = BVUnitT<unsigned_long>::Position(BVar3);
    BVar5 = BVUnitT<unsigned_long>::Offset(start);
    BVar3 = BVUnitT<unsigned_long>::Offset(BVar3);
    if (BVar3 < 0x3f) {
      local_70 = (1L << ((char)BVar3 + 1U & 0x3f)) - 1;
    }
    else {
      local_70 = 0xffffffffffffffff;
    }
    bVar9 = (byte)BVar5;
    if (local_60 == BVar4) {
      uVar7 = BVUnitT<unsigned_long>::GetWord
                        ((BVUnitT<unsigned_long> *)(this + (ulong)local_60 + 1));
      startWord = (local_70 & uVar7) >> (bVar9 & 0x3f);
    }
    else if (local_60 + 1 == BVar4) {
      uVar7 = BVUnitT<unsigned_long>::GetWord
                        ((BVUnitT<unsigned_long> *)(this + (ulong)local_60 + 1));
      uVar8 = BVUnitT<unsigned_long>::GetWord((BVUnitT<unsigned_long> *)(this + (ulong)BVar4 + 1));
      startWord = (local_70 & uVar8) << (0x40 - bVar9 & 0x3f) | uVar7 >> (bVar9 & 0x3f);
    }
    else {
      uVar7 = BVUnitT<unsigned_long>::GetWord
                        ((BVUnitT<unsigned_long> *)(this + (ulong)local_60 + 1));
      startWord = uVar7 >> (bVar9 & 0x3f);
      local_5c = -BVar5;
      while( true ) {
        local_5c = local_5c + 0x40;
        local_60 = local_60 + 1;
        if (BVar4 <= local_60) break;
        uVar7 = BVUnitT<unsigned_long>::GetWord
                          ((BVUnitT<unsigned_long> *)(this + (ulong)local_60 + 1));
        startWord = uVar7 << ((byte)local_5c & 0x3f) | startWord;
      }
      uVar7 = BVUnitT<unsigned_long>::GetWord((BVUnitT<unsigned_long> *)(this + (ulong)BVar4 + 1));
      startWord = (local_70 & uVar7) << ((byte)local_5c & 0x3f) | startWord;
    }
    Js::LoopFlags::LoopFlags((LoopFlags *)((long)&this_local + 7),startWord);
  }
  return this_local._7_1_;
}

Assistant:

Container BVFixed::GetRange(BVIndex start, BVIndex len) const
{
    AssertRange(start);
    if (len == 0)
    {
        return Container(0);
    }
    Assert(len <= sizeof(Container) * MachBits);
    AssertMsg(len <= 64, "Currently doesn't support range bigger than 64 bits");
    BVIndex end = start + len - 1;
    AssertRange(end);
    BVIndex iStart = BVUnit::Position(start);
    BVIndex iEnd = BVUnit::Position(end);
    BVIndex oStart = BVUnit::Offset(start);
    BVIndex oEnd = BVUnit::Offset(end);
    // Simply using uint64 because it is much easier than to juggle with BVUnit::BVUnitTContainer's size
    // Special case, if oEnd == 63, 1 << 64 == 1. Therefore the result is incorrect
    uint64 mask = oEnd < 63 ? (((uint64)1 << (oEnd + 1)) - 1) : 0xFFFFFFFFFFFFFFFF;
    uint64 range;
    // Trivial case
    if (iStart == iEnd)
    {
        // remove the bits after oEnd with mask, then remove the bits before start with shift
        range = (mask & this->data[iStart].GetWord()) >> oStart;
    }
    // Still simple enough
    else if (iStart + 1 == iEnd)
    {
        auto startWord = this->data[iStart].GetWord();
        auto endWord = this->data[iEnd].GetWord();
        // remove the bits before start with shift
        range = startWord >> oStart;
        // remove the bits after oEnd with mask then position it after start bits
        range |= (mask & endWord) << (BVUnit::BitsPerWord - oStart);
    }
    // Spans over multiple value, need to loop
    else
    {
        // Get the first bits and move them to the beginning
        range = this->data[iStart].GetWord() >> oStart;
        // track how many bits have been read so far
        int nBitsUsed = BVUnit::BitsPerWord - oStart;
        for (uint i = iStart + 1; i < iEnd; ++i)
        {
            // put all bits from the data in the mid-range. Use the tracked read bits to position them
            range |= ((uint64)(this->data[i].GetWord())) << nBitsUsed;
            nBitsUsed += BVUnit::BitsPerWord;
        }
        // Read the last bits and remove those after oEnd with mask
        range |= (mask & this->data[iEnd].GetWord()) << nBitsUsed;
    }
    return Container(range);
}